

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cc
# Opt level: O2

void __thiscall flow::Value::~Value(Value *this)

{
  ~Value(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

Value::~Value() {
  FLOW_ASSERT(!isUsed(), fmt::format(
              "Value being destroyed is still in use by: {}.",
              join(uses_, ", ", &Instr::name)));
}